

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDynAr.h
# Opt level: O2

void __thiscall NaDynAr<NaControlLawItem>::item::~item(item *this)

{
  NaControlLawItem *pNVar1;
  
  pNVar1 = this->pData;
  if (pNVar1 == (NaControlLawItem *)0x0) {
    NaPrintLog("data=0x%08p removed twice\n",0);
    pNVar1 = this->pData;
    if (pNVar1 == (NaControlLawItem *)0x0) goto LAB_00133e10;
  }
  (*(pNVar1->super_NaConfigPart)._vptr_NaConfigPart[1])();
LAB_00133e10:
  this->pData = (NaControlLawItem *)0x0;
  return;
}

Assistant:

~item () {
      if(NULL == pData)
	NaPrintLog("data=0x%08p removed twice\n", pData);
      delete pData;
      pData = NULL;
    }